

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void Fossilize::Hashing::hash_specialization_info(Hasher *h,VkSpecializationInfo *spec)

{
  void *pvVar1;
  VkSpecializationMapEntry *pVVar2;
  ulong uVar3;
  long lVar4;
  Hash HVar5;
  ulong uVar6;
  
  uVar3 = spec->dataSize;
  if (uVar3 != 0) {
    pvVar1 = spec->pData;
    HVar5 = h->h;
    uVar6 = 0;
    do {
      HVar5 = HVar5 * 0x100000001b3 ^ (ulong)*(byte *)((long)pvVar1 + uVar6);
      h->h = HVar5;
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  uVar6 = (uVar3 & 0xffffffff ^ h->h * 0x100000001b3) * 0x100000001b3 ^ uVar3 >> 0x20;
  h->h = uVar6;
  uVar3 = (ulong)spec->mapEntryCount;
  h->h = uVar6 * 0x100000001b3 ^ uVar3;
  if (uVar3 != 0) {
    HVar5 = h->h;
    pVVar2 = spec->pMapEntries;
    lVar4 = 0;
    do {
      uVar6 = *(ulong *)((long)&pVVar2->size + lVar4);
      HVar5 = ((uVar6 & 0xffffffff ^
               (HVar5 * 0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar2->offset + lVar4)) *
               0x100000001b3) * 0x100000001b3 ^ uVar6 >> 0x20) * 0x100000001b3 ^
              (ulong)*(uint *)((long)&pVVar2->constantID + lVar4);
      lVar4 = lVar4 + 0x10;
    } while (uVar3 << 4 != lVar4);
    h->h = HVar5;
  }
  return;
}

Assistant:

static void hash_specialization_info(Hasher &h, const VkSpecializationInfo &spec)
{
	h.data(static_cast<const uint8_t *>(spec.pData), spec.dataSize);
	h.u64(spec.dataSize);
	h.u32(spec.mapEntryCount);
	for (uint32_t i = 0; i < spec.mapEntryCount; i++)
	{
		h.u32(spec.pMapEntries[i].offset);
		h.u64(spec.pMapEntries[i].size);
		h.u32(spec.pMapEntries[i].constantID);
	}
}